

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

U32 ZSTD_fracWeight(U32 rawStat)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = rawStat + 1;
  uVar1 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (uVar1 < 0x17) {
    return (uVar2 * 0x100 >> ((byte)uVar1 & 0x1f)) + uVar1 * 0x100;
  }
  __assert_fail("hb + BITCOST_ACCURACY < 31",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x7f60,"U32 ZSTD_fracWeight(U32)");
}

Assistant:

MEM_STATIC U32 ZSTD_fracWeight(U32 rawStat)
{
    U32 const stat = rawStat + 1;
    U32 const hb = ZSTD_highbit32(stat);
    U32 const BWeight = hb * BITCOST_MULTIPLIER;
    /* Fweight was meant for "Fractional weight"
     * but it's effectively a value between 1 and 2
     * using fixed point arithmetic */
    U32 const FWeight = (stat << BITCOST_ACCURACY) >> hb;
    U32 const weight = BWeight + FWeight;
    assert(hb + BITCOST_ACCURACY < 31);
    return weight;
}